

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

Polynomial<double> * OpenMD::operator-(Polynomial<double> *p1,Polynomial<double> *p2)

{
  bool bVar1;
  Polynomial<double> *in_RDI;
  const_iterator i;
  Polynomial<double> *p;
  Polynomial<double> *in_stack_ffffffffffffff88;
  Polynomial<double> *in_stack_ffffffffffffff90;
  _Rb_tree_const_iterator<std::pair<const_int,_double>_> *this;
  Polynomial<double> *pPVar2;
  Polynomial<double> *in_stack_ffffffffffffffb0;
  _Self local_38;
  _Base_ptr local_30;
  _Rb_tree_const_iterator<std::pair<const_int,_double>_> local_28;
  undefined1 local_19;
  
  local_19 = 0;
  pPVar2 = in_RDI;
  Polynomial<double>::Polynomial(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::_Rb_tree_const_iterator(&local_28);
  local_30 = (_Base_ptr)Polynomial<double>::begin(in_stack_ffffffffffffff88);
  local_28._M_node = local_30;
  while( true ) {
    local_38._M_node = (_Base_ptr)Polynomial<double>::end(in_stack_ffffffffffffff88);
    bVar1 = std::operator!=(&local_28,&local_38);
    if (!bVar1) break;
    this = &local_28;
    std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_int,_double>_> *)0x2ece15);
    std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_int,_double>_> *)0x2ece25);
    Polynomial<double>::addCoefficient
              (in_stack_ffffffffffffffb0,(int)((ulong)pPVar2 >> 0x20),(double *)in_RDI);
    std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator++(this);
  }
  return pPVar2;
}

Assistant:

Polynomial<Real> operator-(const Polynomial<Real>& p1,
                             const Polynomial<Real>& p2) {
    Polynomial<Real> p(p1);

    typename Polynomial<Real>::const_iterator i;

    for (i = p2.begin(); i != p2.end(); ++i) {
      p.addCoefficient(i->first, -i->second);
    }

    return p;
  }